

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.h
# Opt level: O0

bool __thiscall Memory::ReferencedArenaAdapter::AddStrongReference(ReferencedArenaAdapter *this)

{
  bool local_11;
  bool retval;
  ReferencedArenaAdapter *this_local;
  
  local_11 = false;
  CCLock::Enter(&(this->adapterLock).super_CCLock);
  if ((this->deleteFlag & 1U) == 0) {
    this->strongRefCount = this->strongRefCount + 1;
    local_11 = true;
  }
  else if ((this->arena != (ArenaAllocator *)0x0) && (this->strongRefCount == 0)) {
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::ArenaAllocator>
              (&HeapAllocator::Instance,this->arena);
    this->arena = (ArenaAllocator *)0x0;
  }
  CCLock::Leave(&(this->adapterLock).super_CCLock);
  return local_11;
}

Assistant:

bool AddStrongReference()
    {
        bool retval = false;
        adapterLock.Enter();

        if (deleteFlag)
        {
            // Arena exists and is marked deleted, we must fail to acquire a new reference
            if (arena && 0 == strongRefCount)
            {
                // All strong references are gone, delete the arena
                HeapDelete(this->arena);
                this->arena = nullptr;
            }
        }
        else
        {
            // Succeed at acquiring a Strong Reference into the Arena
            strongRefCount++;
            retval = true;
        }

        adapterLock.Leave();

        return retval;
    }